

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int16_t WebRtcIsac_RateAllocation
                  (int32_t inRateBitPerSec,double *rateLBBitPerSec,double *rateUBBitPerSec,
                  ISACBandwidth *bandwidthKHz)

{
  short sVar1;
  double dVar2;
  double local_70;
  double local_68;
  int32_t local_54;
  double stepSizeInv_1;
  double stepSizeInv;
  double idxErr;
  double idxD;
  int16_t idx;
  ISACBandwidth *bandwidthKHz_local;
  double *rateUBBitPerSec_local;
  double *rateLBBitPerSec_local;
  int32_t inRateBitPerSec_local;
  
  if (inRateBitPerSec < 38000) {
    local_54 = inRateBitPerSec;
    if (32000 < inRateBitPerSec) {
      local_54 = 32000;
    }
    *rateLBBitPerSec = (double)(int)(short)local_54;
    *rateUBBitPerSec = 0.0;
    *bandwidthKHz = isac8kHz;
  }
  else if ((inRateBitPerSec < 38000) || (49999 < inRateBitPerSec)) {
    if ((inRateBitPerSec < 50000) || (56000 < inRateBitPerSec)) {
      return -1;
    }
    dVar2 = (double)(inRateBitPerSec + -50000) * 0.00083333333;
    if (dVar2 < 5.0) {
      sVar1 = (short)(int)dVar2;
    }
    else {
      sVar1 = 5;
    }
    *rateLBBitPerSec = (double)(int)kLowerBandBitRate16[sVar1];
    *rateUBBitPerSec = (double)(int)kUpperBandBitRate16[sVar1];
    if (sVar1 < 5) {
      *rateLBBitPerSec =
           *rateLBBitPerSec +
           (double)(int)(short)(int)((dVar2 - (double)(int)sVar1) *
                                    (double)((int)kLowerBandBitRate16[(long)sVar1 + 1] -
                                            (int)kLowerBandBitRate16[sVar1]));
      *rateUBBitPerSec =
           (double)(int)(short)(int)((dVar2 - (double)(int)sVar1) *
                                    (double)((int)kUpperBandBitRate16[(long)sVar1 + 1] -
                                            (int)kUpperBandBitRate16[sVar1])) + *rateUBBitPerSec;
    }
    *bandwidthKHz = isac16kHz;
  }
  else {
    dVar2 = (double)(inRateBitPerSec + -38000) * 0.00085714286;
    if (dVar2 < 6.0) {
      sVar1 = (short)(int)dVar2;
    }
    else {
      sVar1 = 6;
    }
    *rateLBBitPerSec = (double)(int)kLowerBandBitRate12[sVar1];
    *rateUBBitPerSec = (double)(int)kUpperBandBitRate12[sVar1];
    if (sVar1 < 6) {
      *rateLBBitPerSec =
           *rateLBBitPerSec +
           (double)(int)(short)(int)((dVar2 - (double)(int)sVar1) *
                                    (double)((int)kLowerBandBitRate12[(long)sVar1 + 1] -
                                            (int)kLowerBandBitRate12[sVar1]));
      *rateUBBitPerSec =
           (double)(int)(short)(int)((dVar2 - (double)(int)sVar1) *
                                    (double)((int)kUpperBandBitRate12[(long)sVar1 + 1] -
                                            (int)kUpperBandBitRate12[sVar1])) + *rateUBBitPerSec;
    }
    *bandwidthKHz = isac12kHz;
  }
  if (*rateLBBitPerSec <= 32000.0) {
    local_68 = *rateLBBitPerSec;
  }
  else {
    local_68 = 32000.0;
  }
  *rateLBBitPerSec = local_68;
  if (*rateUBBitPerSec <= 32000.0) {
    local_70 = *rateUBBitPerSec;
  }
  else {
    local_70 = 32000.0;
  }
  *rateUBBitPerSec = local_70;
  return 0;
}

Assistant:

int16_t WebRtcIsac_RateAllocation(int32_t inRateBitPerSec,
                                        double* rateLBBitPerSec,
                                        double* rateUBBitPerSec,
                                        enum ISACBandwidth* bandwidthKHz) {
  int16_t idx;
  double idxD;
  double idxErr;
  if (inRateBitPerSec < 38000) {
    /* If the given overall bottleneck is less than 38000 then
     * then codec has to operate in wideband mode, i.e. 8 kHz
     * bandwidth. */
    *rateLBBitPerSec = (int16_t)((inRateBitPerSec > 32000) ?
        32000 : inRateBitPerSec);
    *rateUBBitPerSec = 0;
    *bandwidthKHz = isac8kHz;
  } else if ((inRateBitPerSec >= 38000) && (inRateBitPerSec < 50000)) {
    /* At a bottleneck between 38 and 50 kbps the codec is operating
     * at 12 kHz bandwidth. Using xxxBandBitRate12[] to calculates
     * upper/lower bottleneck */

    /* Find the bottlenecks by linear interpolation,
     * step is (45000 - 38000)/6.0 we use the inverse of it. */
    const double stepSizeInv = 8.5714286e-4;
    idxD = (inRateBitPerSec - 38000) * stepSizeInv;
    idx = (idxD >= 6) ? 6 : ((int16_t)idxD);
    idxErr = idxD - idx;
    *rateLBBitPerSec = kLowerBandBitRate12[idx];
    *rateUBBitPerSec = kUpperBandBitRate12[idx];

    if (idx < 6) {
      *rateLBBitPerSec += (int16_t)(
          idxErr * (kLowerBandBitRate12[idx + 1] - kLowerBandBitRate12[idx]));
      *rateUBBitPerSec += (int16_t)(
          idxErr * (kUpperBandBitRate12[idx + 1] - kUpperBandBitRate12[idx]));
    }
    *bandwidthKHz = isac12kHz;
  } else if ((inRateBitPerSec >= 50000) && (inRateBitPerSec <= 56000)) {
    /* A bottleneck between 50 and 56 kbps corresponds to bandwidth
     * of 16 kHz. Using xxxBandBitRate16[] to calculates
     * upper/lower bottleneck. */

    /* Find the bottlenecks by linear interpolation
     * step is (56000 - 50000)/5 we use the inverse of it. */
    const double stepSizeInv = 8.3333333e-4;
    idxD = (inRateBitPerSec - 50000) * stepSizeInv;
    idx = (idxD >= 5) ? 5 : ((int16_t)idxD);
    idxErr = idxD - idx;
    *rateLBBitPerSec = kLowerBandBitRate16[idx];
    *rateUBBitPerSec  = kUpperBandBitRate16[idx];

    if (idx < 5) {
      *rateLBBitPerSec += (int16_t)(idxErr *
          (kLowerBandBitRate16[idx + 1] -
              kLowerBandBitRate16[idx]));

      *rateUBBitPerSec += (int16_t)(idxErr *
          (kUpperBandBitRate16[idx + 1] -
              kUpperBandBitRate16[idx]));
    }
    *bandwidthKHz = isac16kHz;
  } else {
    /* Out-of-range botlteneck value. */
    return -1;
  }

  /* limit the values. */
  *rateLBBitPerSec = (*rateLBBitPerSec > 32000) ? 32000 : *rateLBBitPerSec;
  *rateUBBitPerSec = (*rateUBBitPerSec > 32000) ? 32000 : *rateUBBitPerSec;
  return 0;
}